

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-projection.c
# Opt level: O0

_Bool borg_projectable(wchar_t y1,wchar_t x1,wchar_t y2,wchar_t x2)

{
  uint8_t uVar1;
  _Bool _Var2;
  borg_grid *ag_00;
  borg_grid *ag;
  wchar_t x;
  wchar_t y;
  wchar_t dist;
  wchar_t x2_local;
  wchar_t y2_local;
  wchar_t x1_local;
  wchar_t y1_local;
  
  x = L'\0';
  ag._0_4_ = x1;
  ag._4_4_ = y1;
  y = x2;
  dist = y2;
  x2_local = x1;
  y2_local = y1;
  do {
    if ((int)(uint)z_info->max_range < x) {
      return false;
    }
    ag_00 = borg_grids[ag._4_4_] + (wchar_t)ag;
    if (((borg.trait[0x1b] < borg.trait[0x1c] / 3) || ((borg_morgoth_position & 1U) != 0)) ||
       ((scaryguy_on_level & 1U) != 0)) {
      if (L'\x14' < x) {
        uVar1 = ag_00->feat;
        goto joined_r0x002cf3f9;
      }
    }
    else if (borg.trait[0x1b] < borg.trait[0x1c] / 2) {
      if (L'\n' < x) {
        uVar1 = ag_00->feat;
        goto joined_r0x002cf3f9;
      }
    }
    else if ((int)(uint)borg_fear_region[borg.c.y / 0xb][borg.c.x / 0xb] < (int)avoidance / 0x14) {
      if (L'\x02' < x) {
        uVar1 = ag_00->feat;
        goto joined_r0x002cf3f9;
      }
    }
    else if ((int)(uint)z_info->max_range < x) {
      uVar1 = ag_00->feat;
joined_r0x002cf3f9:
      if (uVar1 == '\0') {
        return false;
      }
    }
    if ((x != L'\0') && (_Var2 = borg_cave_floor_grid(ag_00), !_Var2)) {
      return false;
    }
    if (((wchar_t)ag == y) && (ag._4_4_ == dist)) {
      return true;
    }
    borg_inc_motion((int *)((long)&ag + 4),(int *)&ag,y2_local,x2_local,dist,y);
    x = x + L'\x01';
  } while( true );
}

Assistant:

bool borg_projectable(int y1, int x1, int y2, int x2)
{
    int dist, y, x;

    borg_grid *ag;

    /* Start at the initial location */
    y = y1;
    x = x1;

    /* Simulate the spell/missile path */
    for (dist = 0; dist <= z_info->max_range; dist++) {
        /* Get the grid */
        ag = &borg_grids[y][x];

        if ((borg.trait[BI_CURHP] < borg.trait[BI_MAXHP] / 3
                || borg_morgoth_position || scaryguy_on_level)) {
            /* Assume all unknown grids more than distance 20 from you
             * are walls--when I am wounded. This will make me more fearful
             * of the grids that are up to 19 spaces away.  I treat them as
             * regular floor grids.  Which means monsters are assumed to have
             * LOS on me.  I am also more likely to shoot into the dark grids.
             */
            if ((dist > 20) && (ag->feat == FEAT_NONE))
                break;
        } else if (borg.trait[BI_CURHP] < borg.trait[BI_MAXHP] / 2) {
            /* Assume all unknow grids more than distance 10 from you
             * are walls--when I am wounded. This will make me more fearful
             * of the grids that are up to 9 spaces away.  I treat them as
             * regular floor grids.
             */
            if ((dist > 10) && (ag->feat == FEAT_NONE))
                break;
        } else if (borg_fear_region[borg.c.y / 11][borg.c.x / 11]
                   >= avoidance / 20) {
            /* If a non-LOS monster is attacking me, then it is probably has
             * LOS to me, so do not place walls on unknown grids.  This will
             *allow me the chance to attack monsters.
             *
             * This does not work if the non-LOS monster is invisible.
             * This helps in a case like this:
             *####################			1.  Player has ESP and can sense the
             *priest.
             *......@......      p			2.  Priest has cast a spell at the
             *player.
             *#############					3.  Unknown grids are between player and
             *priest
             *								4.  Borg has created regional fear from non-LOS
             *priest.
             *
             */
            if ((dist > z_info->max_range) && (ag->feat == FEAT_NONE))
                break;
        } else {
            /* Assume all unknow grids more than distance 3 from you
             * are walls.  This makes me brave and chancey.
             */
            if ((dist > 2) && (ag->feat == FEAT_NONE))
                break;
        }
        /* Never pass through walls/doors */
        if (dist && (!borg_cave_floor_grid(ag)))
            break;

        /* Check for arrival at "final target" */
        if ((x == x2) && (y == y2))
            return true;

        /* Calculate the new location */
        borg_inc_motion(&y, &x, y1, x1, y2, x2);
    }

    /* Assume obstruction */
    return false;
}